

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

nh_topten_entry *
nh_get_topten(int *out_len,char *statusbuf,char *player,int top,int around,boolean own)

{
  bool bVar1;
  undefined1 *__ptr;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  boolean off_list;
  boolean *selected;
  int sel_count;
  int j;
  int i;
  int fd;
  int rank;
  boolean game_complete;
  boolean game_inited;
  nh_topten_entry *score_list;
  toptenentry newtt;
  toptenentry *ttlist;
  boolean own_local;
  int around_local;
  int top_local;
  char *player_local;
  char *statusbuf_local;
  int *out_len_local;
  
  bVar4 = dungeon_topology.d_wiz1_level.dlevel != '\0';
  bVar5 = false;
  if ((bVar4) && (bVar5 = false, moves != 0)) {
    bVar5 = program_state.gameover != 0;
  }
  i = -1;
  bVar1 = false;
  *statusbuf = '\0';
  *out_len = 0;
  iVar2 = exit_jmp_buf_valid + 1;
  bVar6 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar2;
  if ((bVar6) && (iVar2 = __sigsetjmp(exit_jmp_buf), iVar2 != 0)) {
    out_len_local = (int *)0x0;
  }
  else {
    if (!bVar4) {
      dlb_init();
      init_dungeons();
    }
    _around_local = player;
    if (player == (char *)0x0) {
      if (bVar5) {
        _around_local = plname;
      }
      else {
        _around_local = "";
      }
    }
    iVar2 = open_datafile("record",0,2);
    newtt.death._92_8_ = read_topten(iVar2,10000);
    close(iVar2);
    if (newtt.death._92_8_ == 0) {
      strcpy(statusbuf,"Cannot open record file!");
      exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
      out_len_local = (int *)0x0;
    }
    else {
      if ((bVar5) && (iVar2 = strcmp(_around_local,plname), iVar2 == 0)) {
        fill_topten_entry((toptenentry *)&score_list,end_how);
        sel_count = 0;
        while( true ) {
          bVar6 = false;
          if ((sel_count < 10000) &&
             (bVar6 = true, *(int *)(newtt.death._92_8_ + (long)sel_count * 0xc0) < 1)) {
            bVar6 = *(int *)(newtt.death._92_8_ + (long)sel_count * 0xc0 + 8) != 0;
          }
          if (!bVar6) break;
          iVar2 = memcmp((void *)(newtt.death._92_8_ + (long)sel_count * 0xc0),&score_list,0xc0);
          if (iVar2 == 0) {
            i = sel_count;
          }
          sel_count = sel_count + 1;
        }
        if ((flags.debug == '\0') && (flags.explore == '\0')) {
          if ((i < 0) || (9 < i)) {
            if (i != 0) {
              pcVar3 = ordin(i + 1);
              sprintf(statusbuf,"You reached the %d%s place on the score list.",(ulong)(i + 1),
                      pcVar3);
            }
          }
          else {
            sprintf(statusbuf,"You made the top ten list!");
          }
        }
        else {
          pcVar3 = "discover";
          if (flags.debug != '\0') {
            pcVar3 = "wizard";
          }
          sprintf(statusbuf,"Since you were in %s mode, your game was not added to the score list.",
                  pcVar3);
        }
      }
      selected._0_4_ = 0;
      __ptr = (undefined1 *)calloc(10000,1);
      sel_count = 0;
      while( true ) {
        bVar6 = false;
        if ((sel_count < 10000) &&
           (bVar6 = true, *(int *)(newtt.death._92_8_ + (long)sel_count * 0xc0) < 1)) {
          bVar6 = *(int *)(newtt.death._92_8_ + (long)sel_count * 0xc0 + 8) != 0;
        }
        if (!bVar6) break;
        if ((top == -1) || (sel_count < top)) {
          __ptr[sel_count] = 1;
        }
        if ((own != '\0') &&
           (iVar2 = strcmp(_around_local,
                           (char *)(newtt.death._92_8_ + (long)sel_count * 0xc0 + 0x4c)), iVar2 == 0
           )) {
          __ptr[sel_count] = 1;
        }
        if (((i != -1) && (i - around <= sel_count)) && (sel_count <= i + around)) {
          __ptr[sel_count] = 1;
        }
        if (__ptr[sel_count] != '\0') {
          selected._0_4_ = (int)selected + 1;
        }
        sel_count = sel_count + 1;
      }
      if ((bVar5) && ((int)selected == 0)) {
        memcpy((void *)newtt.death._92_8_,&score_list,0xc0);
        *__ptr = 1;
        selected._0_4_ = 1;
        bVar1 = true;
      }
      out_len_local = (int *)xmalloc((int)selected * 0x298);
      memset(out_len_local,0,(long)(int)selected * 0x298);
      *out_len = (int)selected;
      selected._4_4_ = 0;
      sel_count = 0;
      while( true ) {
        bVar5 = false;
        if ((sel_count < 10000) &&
           (bVar5 = true, *(int *)(newtt.death._92_8_ + (long)sel_count * 0xc0) < 1)) {
          bVar5 = *(int *)(newtt.death._92_8_ + (long)sel_count * 0xc0 + 8) != 0;
        }
        if (!bVar5) break;
        if (__ptr[sel_count] != '\0') {
          fill_nh_score_entry((toptenentry *)(newtt.death._92_8_ + (long)sel_count * 0xc0),
                              (nh_topten_entry *)(out_len_local + (long)selected._4_4_ * 0xa6),
                              sel_count + 1,sel_count == i);
          selected._4_4_ = selected._4_4_ + 1;
        }
        sel_count = sel_count + 1;
      }
      if (bVar1) {
        *out_len_local = -1;
        *(undefined1 *)(out_len_local + 0xa5) = 1;
      }
      if (!bVar4) {
        free_dungeon();
        dlb_cleanup();
      }
      free(__ptr);
      free((void *)newtt.death._92_8_);
      exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
    }
  }
  return (nh_topten_entry *)out_len_local;
}

Assistant:

struct nh_topten_entry *nh_get_topten(int *out_len, char *statusbuf,
				      const char *player, int top, int around, boolean own)
{
    struct toptenentry *ttlist, newtt;
    struct nh_topten_entry *score_list;
    boolean game_inited = (wiz1_level.dlevel != 0);
    boolean game_complete = game_inited && moves && program_state.gameover;
    int rank = -1; /* index of the completed game in the topten list */
    int fd, i, j, sel_count;
    boolean *selected, off_list = FALSE;
    
    statusbuf[0] = '\0';
    *out_len = 0;
    
    if (!api_entry_checkpoint())
	return NULL;
    
    if (!game_inited) {
	/* If nh_get_topten() isn't called after a game, we never went through
	 * initialization. */
	dlb_init();
	init_dungeons();
    }
    
    if (!player) {
	if (game_complete)
	    player = plname;
	else
	    player = "";
    }
    
    fd = open_datafile(RECORD, O_RDONLY, SCOREPREFIX);
    ttlist = read_topten(fd, TTLISTLEN);
    close(fd);
    if (!ttlist) {
	strcpy(statusbuf, "Cannot open record file!");
	api_exit();
	return NULL;
    }
    
    /* find the rank of a completed game in the score list */
    if (game_complete && !strcmp(player, plname)) {
	fill_topten_entry(&newtt, end_how);
	
	/* find this entry in the list */
	for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++)
	    if (!memcmp(&ttlist[i], &newtt, sizeof(struct toptenentry)))
		rank = i;
	
	if (wizard || discover)
	    sprintf(statusbuf, "Since you were in %s mode, your game was not "
	            "added to the score list.", wizard ? "wizard" : "discover");
	else if (rank >= 0 && rank < 10)
	    sprintf(statusbuf, "You made the top ten list!");
	else if (rank)
	    sprintf(statusbuf, "You reached the %d%s place on the score list.",
		    rank+1, ordin(rank+1));
    }
    
    /* select scores for display */
    sel_count = 0;
    selected = calloc(TTLISTLEN, sizeof(boolean));
    
    for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++) {
	if (top == -1 || i < top)
	    selected[i] = TRUE;
	
	if (own && !strcmp(player, ttlist[i].name))
	    selected[i] = TRUE;
	
	if (rank != -1 && rank - around <= i && i <= rank + around)
	    selected[i] = TRUE;
	
	if (selected[i])
	    sel_count++;
    }
    
    if (game_complete && sel_count == 0) {
	/* didn't make it onto the list and nothing else is selected */
	ttlist[0] = newtt;
	selected[0] = TRUE;
	sel_count++;
	off_list = TRUE;
    }
    
    
    score_list = xmalloc(sel_count * sizeof(struct nh_topten_entry));
    memset(score_list, 0, sel_count * sizeof(struct nh_topten_entry));
    *out_len = sel_count;
    j = 0;
    for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++) {
	if (selected[i])
	    fill_nh_score_entry(&ttlist[i], &score_list[j++], i+1, i == rank);
    }
    
    if (off_list) {
	score_list[0].rank = -1;
	score_list[0].highlight = TRUE;
    }
    
    if (!game_inited) {
	    free_dungeon();
	    dlb_cleanup();
    }
    
    free(selected);
    free(ttlist);
    
    api_exit();
    return score_list;
}